

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

void __thiscall soul::AST::Function::Function(Function *this,Context *c)

{
  SourceCodeText *pSVar1;
  
  (this->super_ASTObject)._vptr_ASTObject = (_func_int **)&PTR__ASTObject_002d4778;
  (this->super_ASTObject).objectType = Function;
  pSVar1 = (c->location).sourceCode.object;
  (this->super_ASTObject).context.location.sourceCode.object = pSVar1;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  (this->super_ASTObject).context.location.location.data = (c->location).location.data;
  (this->super_ASTObject).context.parentScope = c->parentScope;
  (this->super_ASTObject)._vptr_ASTObject = (_func_int **)&PTR__Function_002d5f18;
  (this->super_Scope)._vptr_Scope = (_func_int **)&PTR__Function_002d5f58;
  (this->returnType).object = (Expression *)0x0;
  (this->name).name = (string *)0x0;
  (this->nameLocation).location.sourceCode.object = (SourceCodeText *)0x0;
  (this->nameLocation).location.location.data = (char *)0x0;
  (this->parameters).
  super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parameters).
  super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parameters).
  super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->genericWildcards).
  super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->genericWildcards).
  super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->genericWildcards).
  super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->genericSpecialisations).
  super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->genericSpecialisations).
  super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->genericSpecialisations).
  super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->originalGenericFunction).object = (Function *)0x0;
  (this->originalCallLeadingToSpecialisation).object = (FunctionCall *)0x0;
  (this->annotation).properties.
  super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->annotation).properties.
  super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->annotation).properties.
  super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->annotation).properties.
           super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 5) = 0;
  (this->block).object = (Block *)0x0;
  (this->generatedFunction).object = (Function *)0x0;
  return;
}

Assistant:

ASTObject (ObjectType ot, const Context& c) : objectType (ot), context (c) {}